

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O1

int32_t __thiscall
wasm::Match::Internal::GetComponent<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_0>
::operator()(GetComponent<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_0> *this,
            Literal *lit)

{
  anon_union_16_6_1532cd5a_for_Literal_0 local_28;
  long local_18;
  
  Literal::Literal((Literal *)&local_28.func,lit);
  if (local_18 == 2) {
    Literal::~Literal((Literal *)&local_28.func);
    return local_28.i32;
  }
  __assert_fail("type == Type::i32",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                ,0x120,"int32_t wasm::Literal::geti32() const");
}

Assistant:

decltype(auto) operator()(Literal lit) { return T::getVal(lit); }